

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpackingaligned.cpp
# Opt level: O2

uint32_t * FastPForLib::__fastpackwithoutmask14_8(uint32_t *in,uint32_t *out)

{
  uint uVar1;
  uint32_t uVar2;
  uint uVar3;
  uint32_t uVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  
  uVar1 = in[2];
  uVar2 = in[3];
  *out = uVar1 << 0x1c | in[1] << 0xe | *in;
  uVar3 = in[4];
  uVar4 = in[5];
  out[1] = uVar3 << 0x18 | uVar2 << 10 | uVar1 >> 4;
  auVar6._8_8_ = 0;
  auVar6._0_8_ = *(ulong *)(in + 6);
  auVar5 = vpsllvd_avx2(auVar6,_DAT_001a0620);
  auVar6 = vpinsrd_avx(ZEXT416(uVar4 << 6 | uVar3 >> 8),(uint)(*(ulong *)(in + 6) >> 0xc) & 0xfffff,
                       1);
  auVar6 = vpor_avx(auVar5,auVar6);
  *(long *)(out + 2) = auVar6._0_8_;
  return out + 4;
}

Assistant:

uint32_t *__fastpackwithoutmask14_8(const uint32_t *__restrict__ in,
                                    uint32_t *__restrict__ out) {

  *out = (*in);
  ++in;
  *out |= ((*in)) << 14;
  ++in;
  *out |= ((*in)) << 28;
  ++out;
  *out = ((*in)) >> (14 - 10);
  ++in;
  *out |= ((*in)) << 10;
  ++in;
  *out |= ((*in)) << 24;
  ++out;
  *out = ((*in)) >> (14 - 6);
  ++in;
  *out |= ((*in)) << 6;
  ++in;
  *out |= ((*in)) << 20;
  ++out;
  *out = ((*in)) >> (14 - 2);
  ++in;
  *out |= ((*in)) << 2;
  ++in;

  return out + 1;
}